

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2f151d::ThrowExpr::printLeft(ThrowExpr *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ThrowExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"throw ");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Op,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "throw ";
    Op->print(S);
  }